

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdecode.c
# Opt level: O0

ptrdiff_t rcnb_decode(wchar_t *code_in,size_t length_in,char *plaintext_out)

{
  ptrdiff_t pVar1;
  rcnb_decodestate *state_in;
  size_t in_RDX;
  wchar_t *in_RSI;
  ptrdiff_t block_size;
  size_t output_size;
  rcnb_decodestate es;
  long lVar2;
  char *in_stack_ffffffffffffffc8;
  rcnb_decodestate *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  long local_8;
  
  if (in_RSI == (wchar_t *)0x0) {
    local_8 = 0;
  }
  else {
    rcnb_init_decodestate((rcnb_decodestate *)&stack0xffffffffffffffc8);
    lVar2 = 0;
    pVar1 = rcnb_decode_block(in_RSI,in_RDX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    if (pVar1 < 0) {
      local_8 = -1;
    }
    else {
      state_in = (rcnb_decodestate *)(pVar1 + lVar2);
      pVar1 = rcnb_decode_blockend(in_stack_ffffffffffffffc8,state_in);
      if (pVar1 < 0) {
        local_8 = -1;
      }
      else {
        local_8 = (long)state_in->trailing_code + pVar1 + -8;
      }
    }
  }
  return local_8;
}

Assistant:

ptrdiff_t rcnb_decode(const wchar_t* code_in, size_t length_in, char* plaintext_out)
{
    if (length_in == 0)
        return 0;
    rcnb_decodestate es;
    rcnb_init_decodestate(&es);
    size_t output_size = 0;
    ptrdiff_t block_size = 0;
    block_size = rcnb_decode_block(code_in, length_in, plaintext_out, &es);
    if (block_size < 0)
        return -1;
    output_size += block_size;
    block_size = rcnb_decode_blockend(plaintext_out + output_size, &es);
    if (block_size < 0)
        return -1;
    return output_size + block_size;
}